

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nrom.cpp
# Opt level: O1

uint8_t __thiscall n_e_s::core::Nrom::ppu_read_byte(Nrom *this,uint16_t addr)

{
  pointer puVar1;
  uchar *puVar2;
  pair<int,_unsigned_short> pVar3;
  undefined6 in_register_00000032;
  
  if ((uint)CONCAT62(in_register_00000032,addr) < 0x2000) {
    puVar1 = (this->chr_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->chr_rom_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1) <= (ulong)addr) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    puVar2 = puVar1 + addr;
  }
  else {
    pVar3 = translate_nametable_addr(this,addr,(this->super_IRom).header_.flags_6 & Vertical);
    puVar2 = (this->nametables_)._M_elems[pVar3.first]._M_elems + ((ulong)pVar3 >> 0x20 & 0xffff);
  }
  return *puVar2;
}

Assistant:

uint8_t Nrom::ppu_read_byte(uint16_t addr) const {
    if (addr <= kChrEnd) {
        return chr_rom_.at(addr);
    }
    const auto [index, addr_mod] =
            translate_nametable_addr(addr, header().mirroring());
    return nametables_[index][addr_mod];
}